

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

ChConstraintTwoBodies * __thiscall
chrono::ChLinkMask::GetActiveConstrByNum(ChLinkMask *this,int mnum)

{
  ChConstraintTwoBodies *pCVar1;
  long lVar2;
  int iVar3;
  
  if (0 < (long)this->nconstr) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      pCVar1 = (this->constraints).
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar2];
      if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if (iVar3 == mnum) {
          return pCVar1;
        }
        iVar3 = iVar3 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (this->nconstr != lVar2);
  }
  return (ChConstraintTwoBodies *)0x0;
}

Assistant:

ChConstraintTwoBodies* ChLinkMask::GetActiveConstrByNum(int mnum) {
    int cnt = 0;
    for (int i = 0; i < nconstr; i++) {
        if (Constr_N(i).IsActive()) {
            if (cnt == mnum)
                return &Constr_N(i);
            cnt++;
        }
    }
    return NULL;
}